

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMonthsOperator>
               (int *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long uVar3;
  undefined8 *puVar4;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  ValidityMask *in_RDX;
  void *in_RSI;
  void *in_RDI;
  interval_t iVar5;
  byte in_stack_00000008;
  idx_t i;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  interval_t in_stack_ffffffffffffff58;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  ValidityMask *mask_00;
  interval_t local_90;
  int64_t iStack_88;
  idx_t in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  int64_t local_68;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long local_40;
  byte local_31;
  TemplatedValidityMask<unsigned_long> *local_20;
  ValidityMask *local_18;
  void *local_10;
  int input;
  
  local_31 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RDX * 4),in_RSI,
             (void *)((long)in_RSI + (long)in_RDX * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_20);
  if (bVar2) {
    for (mask_00 = (ValidityMask *)0x0; mask_00 < local_18;
        mask_00 = (ValidityMask *)
                  ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      in_stack_ffffffffffffff58 =
           UnaryOperatorWrapper::Operation<duckdb::ToMonthsOperator,int,duckdb::interval_t>
                     (input,mask_00,in_stack_ffffffffffffff58.micros,in_stack_ffffffffffffff58._0_8_
                     );
      puVar4 = (undefined8 *)((long)local_10 + (long)mask_00 * 0x10);
      *puVar4 = in_stack_ffffffffffffff58._0_8_;
      puVar4[1] = in_stack_ffffffffffffff58.micros;
    }
  }
  else {
    if ((local_31 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff58.micros,
                 in_stack_ffffffffffffff58._0_8_);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    local_40 = 0;
    local_48 = TemplatedValidityMask<unsigned_long>::EntryCount(0x1f86447);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff58.micros);
      uVar3 = MinValue<unsigned_long>(local_40 + 0x40,(unsigned_long)local_18);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar2) {
        for (; uVar1 = local_40, local_40 < uVar3; local_40 = local_40 + 1) {
          iVar5 = UnaryOperatorWrapper::Operation<duckdb::ToMonthsOperator,int,duckdb::interval_t>
                            (input,(ValidityMask *)in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff58.micros,in_stack_ffffffffffffff58._0_8_);
          puVar4 = (undefined8 *)((long)local_10 + local_40 * 0x10);
          *puVar4 = iVar5._0_8_;
          local_68 = iVar5.micros;
          puVar4[1] = local_68;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        uVar1 = uVar3;
        if (!bVar2) {
          for (; uVar1 = local_40, local_40 < uVar3; local_40 = local_40 + 1) {
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_58,(idx_t *)&stack0xffffffffffffff80);
            if (bVar2) {
              local_90 = UnaryOperatorWrapper::
                         Operation<duckdb::ToMonthsOperator,int,duckdb::interval_t>
                                   (input,(ValidityMask *)in_stack_ffffffffffffff68,
                                    in_stack_ffffffffffffff58.micros,in_stack_ffffffffffffff58._0_8_
                                   );
              puVar4 = (undefined8 *)((long)local_10 + local_40 * 0x10);
              *puVar4 = local_90._0_8_;
              puVar4[1] = iStack_88;
            }
          }
        }
      }
      local_40 = uVar1;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}